

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

_Bool sparc_cpu_tlb_fill_sparc64
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  int iVar1;
  target_ulong *in_stack_ffffffffffffffb8;
  int prot;
  MemTxAttrs attrs;
  target_ulong page_size;
  hwaddr paddr;
  
  attrs = (MemTxAttrs)0x0;
  iVar1 = get_physical_address
                    ((CPUSPARCState_conflict1 *)(cs[1].tb_jmp_cache + 0x1f5),&paddr,&prot,
                     (int *)&attrs,(MemTxAttrs *)(address & 0xffffffffffffe000),(ulong)access_type,
                     mmu_idx,(int)&page_size,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    tlb_set_page_with_attrs_sparc64
              (cs,(target_ulong)(address & 0xffffffffffffe000),paddr,attrs,prot,mmu_idx,page_size);
  }
  else if (!probe) {
    cpu_loop_exit_restore_sparc64(cs,retaddr);
  }
  return iVar1 == 0;
}

Assistant:

bool sparc_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                        MMUAccessType access_type, int mmu_idx,
                        bool probe, uintptr_t retaddr)
{
    SPARCCPU *cpu = SPARC_CPU(cs);
    CPUSPARCState *env = &cpu->env;
    target_ulong vaddr;
    hwaddr paddr;
    target_ulong page_size;
    MemTxAttrs attrs = { 0 };
    int error_code = 0, prot, access_index;

    address &= TARGET_PAGE_MASK;
    error_code = get_physical_address(env, &paddr, &prot, &access_index, &attrs,
                                      address, access_type,
                                      mmu_idx, &page_size);
    if (likely(error_code == 0)) {
        vaddr = address;

        tlb_set_page_with_attrs(cs, vaddr, paddr, attrs, prot, mmu_idx,
                                page_size);
        return true;
    }
    if (probe) {
        return false;
    }
    cpu_loop_exit_restore(cs, retaddr);
}